

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanohttp.c
# Opt level: O1

int xmlNanoHTTPSave(void *ctxt,char *filename)

{
  int iVar1;
  int __fd;
  ssize_t sVar2;
  xmlNanoHTTPCtxtPtr ctxt_1;
  int iVar3;
  char *buf;
  int len;
  char *local_38;
  int local_2c;
  
  local_38 = (char *)0x0;
  iVar3 = -1;
  if (filename != (char *)0x0 && ctxt != (void *)0x0) {
    iVar1 = strcmp(filename,"-");
    iVar3 = 0;
    __fd = 0;
    if ((iVar1 != 0) && (__fd = open64(filename,0x41,0x1b6), __fd < 0)) {
      xmlNanoHTTPFreeCtxt((xmlNanoHTTPCtxtPtr)ctxt);
      return -1;
    }
    xmlNanoHTTPFetchContent(ctxt,&local_38,&local_2c);
    if (0 < (long)local_2c) {
      sVar2 = write(__fd,local_38,(long)local_2c);
      iVar3 = -(uint)(sVar2 == -1);
    }
    xmlNanoHTTPFreeCtxt((xmlNanoHTTPCtxtPtr)ctxt);
    close(__fd);
  }
  return iVar3;
}

Assistant:

int
xmlNanoHTTPSave(void *ctxt, const char *filename) {
    char *buf = NULL;
    int fd;
    int len;
    int ret = 0;

    if ((ctxt == NULL) || (filename == NULL)) return(-1);

    if (!strcmp(filename, "-"))
        fd = 0;
    else {
        fd = open(filename, O_CREAT | O_WRONLY, 0666);
	if (fd < 0) {
	    xmlNanoHTTPClose(ctxt);
	    return(-1);
	}
    }

    xmlNanoHTTPFetchContent( ctxt, &buf, &len );
    if ( len > 0 ) {
	if (write(fd, buf, len) == -1) {
	    ret = -1;
	}
    }

    xmlNanoHTTPClose(ctxt);
    close(fd);
    return(ret);
}